

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environment.cpp
# Opt level: O2

bool __thiscall Environment::hasSymbol(Environment *this,Identifier *ident)

{
  __type _Var1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->symbols)._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var2 + 2),ident);
  } while (!_Var1);
  return p_Var2 != (__node_base *)0x0;
}

Assistant:

bool Environment::hasSymbol(const Identifier& ident) {
    for(auto& it : symbols) {
        if(it.first.name == ident)
            return true;
    }
    return false;
}